

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LocalGraph.cpp
# Opt level: O0

SetInfluences * __thiscall
wasm::LocalGraphFlower::getSetInfluencesGivenObstacle
          (SetInfluences *__return_storage_ptr__,LocalGraphFlower *this,LocalSet *set,
          SetInfluences *gets,Expression *obstacle)

{
  type pFVar1;
  Expression *this_00;
  bool bVar2;
  reference ppLVar3;
  mapped_type *pmVar4;
  type *ppFVar5;
  type *ptVar6;
  reference ppFVar7;
  size_type sVar8;
  reference ppEVar9;
  LocalSet *pLVar10;
  pair<wasm::LocalGraphFlower::FlowBlock_*,_unsigned_int> pVar11;
  pair<wasm::LocalGraphFlower::FlowBlock_*,_unsigned_int> item;
  byte local_20a;
  LocalSet *otherSet;
  Expression *action;
  undefined1 local_1c0 [12];
  FlowBlock *local_1b0;
  FlowBlock *pred;
  iterator __end6;
  iterator __begin6;
  vector<wasm::LocalGraphFlower::FlowBlock_*,_std::allocator<wasm::LocalGraphFlower::FlowBlock_*>_>
  *__range6;
  type *index_1;
  type *block_1;
  pair<wasm::LocalGraphFlower::FlowBlock_*,_unsigned_int> local_170;
  byte local_159;
  undefined8 uStack_158;
  bool foundSet;
  undefined4 local_150;
  undefined1 local_148 [8];
  UniqueNonrepeatingDeferredQueue<std::pair<wasm::LocalGraphFlower::FlowBlock_*,_unsigned_int>_>
  work;
  type *index;
  type *block;
  pair<wasm::LocalGraphFlower::FlowBlock_*,_unsigned_int> local_68;
  value_type local_58;
  LocalGet *get;
  const_iterator __end2;
  const_iterator __begin2;
  SetInfluences *__range2;
  Expression *obstacle_local;
  SetInfluences *gets_local;
  LocalSet *set_local;
  LocalGraphFlower *this_local;
  SetInfluences *ret;
  
  std::
  unordered_set<wasm::LocalGet_*,_std::hash<wasm::LocalGet_*>,_std::equal_to<wasm::LocalGet_*>,_std::allocator<wasm::LocalGet_*>_>
  ::unordered_set(__return_storage_ptr__);
  __end2 = std::
           unordered_set<wasm::LocalGet_*,_std::hash<wasm::LocalGet_*>,_std::equal_to<wasm::LocalGet_*>,_std::allocator<wasm::LocalGet_*>_>
           ::begin(gets);
  get = (LocalGet *)
        std::
        unordered_set<wasm::LocalGet_*,_std::hash<wasm::LocalGet_*>,_std::equal_to<wasm::LocalGet_*>,_std::allocator<wasm::LocalGet_*>_>
        ::end(gets);
  do {
    bVar2 = std::__detail::operator!=
                      (&__end2.super__Node_iterator_base<wasm::LocalGet_*,_false>,
                       (_Node_iterator_base<wasm::LocalGet_*,_false> *)&get);
    if (!bVar2) {
      return __return_storage_ptr__;
    }
    ppLVar3 = std::__detail::_Node_const_iterator<wasm::LocalGet_*,_true,_false>::operator*(&__end2)
    ;
    local_58 = *ppLVar3;
    pmVar4 = std::
             unordered_map<wasm::LocalGet_*,_std::pair<wasm::LocalGraphFlower::FlowBlock_*,_unsigned_int>,_std::hash<wasm::LocalGet_*>,_std::equal_to<wasm::LocalGet_*>,_std::allocator<std::pair<wasm::LocalGet_*const,_std::pair<wasm::LocalGraphFlower::FlowBlock_*,_unsigned_int>_>_>_>
             ::operator[](&this->getLocations,&local_58);
    local_68.first = pmVar4->first;
    local_68.second = pmVar4->second;
    local_68._12_4_ = *(undefined4 *)&pmVar4->field_0xc;
    ppFVar5 = std::get<0ul,wasm::LocalGraphFlower::FlowBlock*,unsigned_int>(&local_68);
    work.processed._M_h._M_single_bucket =
         (__node_base_ptr)std::get<1ul,wasm::LocalGraphFlower::FlowBlock*,unsigned_int>(&local_68);
    if (*ppFVar5 != (type)0x0) {
      UniqueNonrepeatingDeferredQueue<std::pair<wasm::LocalGraphFlower::FlowBlock_*,_unsigned_int>_>
      ::UniqueNonrepeatingDeferredQueue
                ((UniqueNonrepeatingDeferredQueue<std::pair<wasm::LocalGraphFlower::FlowBlock_*,_unsigned_int>_>
                  *)local_148);
      std::pair<wasm::LocalGraphFlower::FlowBlock_*,_unsigned_int>::
      pair<wasm::LocalGraphFlower::FlowBlock_*&,_unsigned_int_&,_true>
                ((pair<wasm::LocalGraphFlower::FlowBlock_*,_unsigned_int> *)&stack0xfffffffffffffea8
                 ,ppFVar5,(uint *)work.processed._M_h._M_single_bucket);
      pVar11._12_4_ = 0;
      pVar11.first = (FlowBlock *)uStack_158;
      pVar11.second = local_150;
      UniqueNonrepeatingDeferredQueue<std::pair<wasm::LocalGraphFlower::FlowBlock_*,_unsigned_int>_>
      ::push((UniqueNonrepeatingDeferredQueue<std::pair<wasm::LocalGraphFlower::FlowBlock_*,_unsigned_int>_>
              *)local_148,pVar11);
      local_159 = 0;
LAB_01918f62:
      bVar2 = UniqueDeferredQueue<std::pair<wasm::LocalGraphFlower::FlowBlock_*,_unsigned_int>_>::
              empty((UniqueDeferredQueue<std::pair<wasm::LocalGraphFlower::FlowBlock_*,_unsigned_int>_>
                     *)local_148);
      local_20a = 0;
      if (!bVar2) {
        local_20a = local_159 ^ 0xff;
      }
      if ((local_20a & 1) != 0) {
        pVar11 = UniqueNonrepeatingDeferredQueue<std::pair<wasm::LocalGraphFlower::FlowBlock_*,_unsigned_int>_>
                 ::pop((UniqueNonrepeatingDeferredQueue<std::pair<wasm::LocalGraphFlower::FlowBlock_*,_unsigned_int>_>
                        *)local_148);
        local_170.first = pVar11.first;
        local_170.second = pVar11.second;
        ppFVar5 = std::get<0ul,wasm::LocalGraphFlower::FlowBlock*,unsigned_int>(&local_170);
        ptVar6 = std::get<1ul,wasm::LocalGraphFlower::FlowBlock*,unsigned_int>(&local_170);
LAB_0191901d:
        if (*ptVar6 != 0) {
          *ptVar6 = *ptVar6 - 1;
          ppEVar9 = std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::operator[]
                              (&(*ppFVar5)->actions,(ulong)*ptVar6);
          this_00 = *ppEVar9;
          pLVar10 = Expression::dynCast<wasm::LocalSet>(this_00);
          if (pLVar10 != (LocalSet *)0x0) {
            if (pLVar10 == set) {
              std::
              unordered_set<wasm::LocalGet_*,_std::hash<wasm::LocalGet_*>,_std::equal_to<wasm::LocalGet_*>,_std::allocator<wasm::LocalGet_*>_>
              ::insert(__return_storage_ptr__,&local_58);
              local_159 = 1;
              goto LAB_01918f62;
            }
            if (pLVar10->index == set->index) goto LAB_01918f62;
            goto LAB_0191901d;
          }
          if (this_00 == obstacle) goto LAB_01918f62;
          goto LAB_0191901d;
        }
        pFVar1 = *ppFVar5;
        __end6 = std::
                 vector<wasm::LocalGraphFlower::FlowBlock_*,_std::allocator<wasm::LocalGraphFlower::FlowBlock_*>_>
                 ::begin(&pFVar1->in);
        pred = (FlowBlock *)
               std::
               vector<wasm::LocalGraphFlower::FlowBlock_*,_std::allocator<wasm::LocalGraphFlower::FlowBlock_*>_>
               ::end(&pFVar1->in);
        while (bVar2 = __gnu_cxx::operator!=
                                 (&__end6,(__normal_iterator<wasm::LocalGraphFlower::FlowBlock_**,_std::vector<wasm::LocalGraphFlower::FlowBlock_*,_std::allocator<wasm::LocalGraphFlower::FlowBlock_*>_>_>
                                           *)&pred), bVar2) {
          ppFVar7 = __gnu_cxx::
                    __normal_iterator<wasm::LocalGraphFlower::FlowBlock_**,_std::vector<wasm::LocalGraphFlower::FlowBlock_*,_std::allocator<wasm::LocalGraphFlower::FlowBlock_*>_>_>
                    ::operator*(&__end6);
          local_1b0 = *ppFVar7;
          sVar8 = std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::size
                            (&local_1b0->actions);
          action._4_4_ = (undefined4)sVar8;
          std::pair<wasm::LocalGraphFlower::FlowBlock_*,_unsigned_int>::
          pair<wasm::LocalGraphFlower::FlowBlock_*&,_unsigned_int,_true>
                    ((pair<wasm::LocalGraphFlower::FlowBlock_*,_unsigned_int> *)local_1c0,&local_1b0
                     ,(uint *)((long)&action + 4));
          item._12_4_ = 0;
          item.first = (FlowBlock *)local_1c0._0_8_;
          item.second = local_1c0._8_4_;
          UniqueNonrepeatingDeferredQueue<std::pair<wasm::LocalGraphFlower::FlowBlock_*,_unsigned_int>_>
          ::push((UniqueNonrepeatingDeferredQueue<std::pair<wasm::LocalGraphFlower::FlowBlock_*,_unsigned_int>_>
                  *)local_148,item);
          __gnu_cxx::
          __normal_iterator<wasm::LocalGraphFlower::FlowBlock_**,_std::vector<wasm::LocalGraphFlower::FlowBlock_*,_std::allocator<wasm::LocalGraphFlower::FlowBlock_*>_>_>
          ::operator++(&__end6);
        }
        goto LAB_01918f62;
      }
      UniqueNonrepeatingDeferredQueue<std::pair<wasm::LocalGraphFlower::FlowBlock_*,_unsigned_int>_>
      ::~UniqueNonrepeatingDeferredQueue
                ((UniqueNonrepeatingDeferredQueue<std::pair<wasm::LocalGraphFlower::FlowBlock_*,_unsigned_int>_>
                  *)local_148);
    }
    std::__detail::_Node_const_iterator<wasm::LocalGet_*,_true,_false>::operator++(&__end2);
  } while( true );
}

Assistant:

LocalGraphBase::SetInfluences
  getSetInfluencesGivenObstacle(LocalSet* set,
                                const LocalGraphBase::SetInfluences& gets,
                                Expression* obstacle) {
    LocalGraphBase::SetInfluences ret;
    // Normally flowing backwards is faster, as we start from actual gets (and
    // so we avoid flowing past all the gets to large swaths of the program that
    // we don't care about; and in reverse, we might go all the way to the
    // entry in a wasteful manner, but most gets have an actual set, and do not
    // read the default value). The situation here is a bit different, though,
    // in that we might expect that going forward from the set would quickly
    // reach the obstacle and stop. Still, a single branch away would cause us
    // to scan lots of blocks potentially, and might not be that rare in
    // general, so go backwards. (Many uninteresting branches away, that reach
    // no relevant gets, are common when exceptions are enabled, as every call
    // gets a branch.)
    for (auto* get : gets) {
      auto [block, index] = getLocations[get];
      if (!block) {
        // We did not find location info for this get, which means it is
        // unreachable.
        continue;
      }

      // Use a work queue of block locations to scan backwards from.
      // Specifically we must scan the first index above it (i.e., the original
      // location has a local.get there, so we start one before it).
      UniqueNonrepeatingDeferredQueue<BlockLocation> work;
      work.push(BlockLocation{block, index});
      auto foundSet = false;
      // Flow while there is stuff to flow, and while we haven't found the set
      // (once we find it, we add the get and can move on to the next get).
      while (!work.empty() && !foundSet) {
        auto [block, index] = work.pop();

        // Scan backwards through this block.
        while (1) {
          // If we finished scanning this block (we reached the top), flow to
          // predecessors.
          if (index == 0) {
            for (auto* pred : block->in) {
              // We will scan pred from its very end.
              work.push(BlockLocation{pred, Index(pred->actions.size())});
            }
            break;
          }

          // Continue onwards.
          index--;
          auto* action = block->actions[index];
          if (auto* otherSet = action->dynCast<LocalSet>()) {
            if (otherSet == set) {
              // We arrived at the set: add this get and stop flowing it.
              ret.insert(get);
              foundSet = true;
              break;
            }
            if (otherSet->index == set->index) {
              // This is another set of the same index, which halts the flow.
              break;
            }
          } else if (action == obstacle) {
            // We ran into the obstacle. Halt this flow.
            break;
          }
          // TODO: If the action is one of the gets we are scanning, then
          // either we have processed it already, or will do so later, and we
          // can halt. As an optimization, we could check if we've processed
          // it already and act accordingly.
        }
      }
    }

    return ret;
  }